

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int arkSetCFLFraction(void *arkode_mem,realtype cfl_frac)

{
  int iVar1;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem local_18;
  ARKodeHAdaptMem local_10;
  
  iVar1 = arkAccessHAdaptMem(arkode_mem,"arkSetCFLFraction",&local_18,&local_10);
  if (iVar1 == 0) {
    if (1.0 <= cfl_frac) {
      iVar1 = -0x16;
      arkProcessError(local_18,-0x16,"ARKode","arkSetCFLFraction","Illegal CFL fraction");
    }
    else {
      if (cfl_frac <= 0.0) {
        local_10->cfl = 0.5;
      }
      else {
        local_10->cfl = cfl_frac;
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int arkSetCFLFraction(void *arkode_mem, realtype cfl_frac)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetCFLFraction",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* check for allowable parameters */
  if (cfl_frac >= ONE) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSetCFLFraction", "Illegal CFL fraction");
    return(ARK_ILL_INPUT);
  }

  /* set positive-valued parameters, otherwise set default */
  if (cfl_frac <= ZERO) {
    hadapt_mem->cfl = CFLFAC;
  } else {
    hadapt_mem->cfl = cfl_frac;
  }

  return(ARK_SUCCESS);
}